

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RiemannR.cpp
# Opt level: O0

double anon_unknown.dwarf_14c159::RiemannR_inverse<double>(double x)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double term;
  int i;
  double old_term;
  double t;
  double in_stack_ffffffffffffffc8;
  double dVar3;
  int local_24;
  double local_18;
  double in_stack_fffffffffffffff8;
  
  if (1.0 <= in_XMM0_Qa) {
    local_18 = initialNthPrimeApprox<double>(in_stack_ffffffffffffffc8);
    std::numeric_limits<double>::infinity();
    for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
      dVar1 = RiemannR<double>(in_stack_fffffffffffffff8);
      dVar2 = log(local_18);
      std::abs(in_EDI);
      dVar3 = extraout_XMM0_Qa;
      std::abs(in_EDI);
      if (extraout_XMM0_Qa_00 <= dVar3) {
        return local_18;
      }
      local_18 = local_18 - (dVar1 - in_XMM0_Qa) * dVar2;
    }
  }
  else {
    local_18 = 0.0;
  }
  return local_18;
}

Assistant:

T RiemannR_inverse(T x)
{
  if (x < 1)
    return 0;

  T t = initialNthPrimeApprox(x);
  T old_term = pstd::numeric_limits<T>::infinity();

  // The condition i < ITERS is required in case the computation
  // does not converge. This happened on Linux i386 where
  // the precision of the libc math functions is very limited.
  for (int i = 0; i < 10; i++)
  {
    // term = f(t) / f'(t)
    // f(t) = RiemannR(t) - x
    // RiemannR(t) ~ li(t), hence f'(t) = li'(t) = 1 / log(t)
    // term = (RiemannR(t) - x) / li'(t) = (RiemannR(t) - x) * log(t)
    T term = (RiemannR(t) - x) * std::log(t);

    // Not converging anymore
    if (std::abs(term) >= std::abs(old_term))
      break;

    t -= term;
    old_term = term;
  }

  return t;
}